

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendstate.c
# Opt level: O2

void quicly_sendstate_init_closed(quicly_sendstate_t *state)

{
  quicly_sendstate_init(state);
  ((state->acked).ranges)->end = 1;
  state->final_size = 0;
  return;
}

Assistant:

void quicly_sendstate_init_closed(quicly_sendstate_t *state)
{
    quicly_sendstate_init(state);
    state->acked.ranges[0].end = 1;
    state->final_size = 0;
}